

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O1

long __thiscall mkvparser::VideoTrack::Seek(VideoTrack *this,longlong time_ns,BlockEntry **pResult)

{
  Cluster **ppCVar1;
  Cluster *pCluster;
  Segment *pSVar2;
  int iVar3;
  long lVar4;
  undefined4 extraout_var;
  longlong lVar5;
  BlockEntry *pBVar6;
  long lVar7;
  Cluster **ppCVar8;
  ulong uVar9;
  Cluster **ppCVar10;
  
  lVar4 = Track::GetFirst(&this->super_Track,pResult);
  if (-1 < lVar4) {
    iVar3 = (*(*pResult)->_vptr_BlockEntry[3])();
    if (iVar3 != 0) {
      pCluster = (*pResult)->m_pCluster;
      iVar3 = (*(*pResult)->_vptr_BlockEntry[2])();
      lVar5 = Block::GetTimeCode((Block *)CONCAT44(extraout_var,iVar3),pCluster);
      lVar4 = pCluster->m_pSegment->m_pInfo->m_timecodeScale;
      if ((lVar5 == 0) ||
         (lVar7 = -1,
         lVar4 <= SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / SEXT816(lVar5),0))) {
        lVar7 = lVar4 * lVar5;
      }
      if (lVar7 < time_ns) {
        pSVar2 = (this->super_Track).m_pSegment;
        ppCVar10 = pSVar2->m_clusters;
        lVar4 = pSVar2->m_clusterCount;
        ppCVar1 = ppCVar10 + pCluster->m_index;
        ppCVar8 = ppCVar1;
        if (pCluster->m_index < lVar4) {
          ppCVar10 = ppCVar10 + lVar4;
          do {
            uVar9 = ((long)ppCVar10 - (long)ppCVar8 >> 3) - ((long)ppCVar10 - (long)ppCVar8 >> 0x3f)
                    & 0xfffffffffffffffe;
            lVar5 = Cluster::GetTime(*(Cluster **)((long)ppCVar8 + uVar9 * 4));
            if (time_ns < lVar5) {
              ppCVar10 = (Cluster **)(uVar9 * 4 + (long)ppCVar8);
            }
            else {
              ppCVar8 = (Cluster **)((long)ppCVar8 + uVar9 * 4 + 8);
            }
          } while (ppCVar8 < ppCVar10);
        }
        pBVar6 = Cluster::GetEntry(ppCVar8[-1],&this->super_Track,time_ns);
        *pResult = pBVar6;
        if ((pBVar6 == (BlockEntry *)0x0) ||
           (iVar3 = (*pBVar6->_vptr_BlockEntry[3])(pBVar6), iVar3 == 0)) {
          while (ppCVar8 = ppCVar8 + -1, ppCVar8 != ppCVar1) {
            pBVar6 = Cluster::GetEntry(ppCVar8[-1],&this->super_Track,time_ns);
            *pResult = pBVar6;
            if ((pBVar6 != (BlockEntry *)0x0) &&
               (iVar3 = (*pBVar6->_vptr_BlockEntry[3])(pBVar6), iVar3 != 0)) {
              return 0;
            }
          }
          *pResult = &(this->super_Track).m_eos.super_BlockEntry;
        }
      }
    }
    lVar4 = 0;
  }
  return lVar4;
}

Assistant:

long VideoTrack::Seek(long long time_ns, const BlockEntry*& pResult) const {
  const long status = GetFirst(pResult);

  if (status < 0)  // buffer underflow, etc
    return status;

  assert(pResult);

  if (pResult->EOS())
    return 0;

  const Cluster* pCluster = pResult->GetCluster();
  assert(pCluster);
  assert(pCluster->GetIndex() >= 0);

  if (time_ns <= pResult->GetBlock()->GetTime(pCluster))
    return 0;

  Cluster** const clusters = m_pSegment->m_clusters;
  assert(clusters);

  const long count = m_pSegment->GetCount();  // loaded only, not pre-loaded
  assert(count > 0);

  Cluster** const i = clusters + pCluster->GetIndex();
  assert(i);
  assert(*i == pCluster);
  assert(pCluster->GetTime() <= time_ns);

  Cluster** const j = clusters + count;

  Cluster** lo = i;
  Cluster** hi = j;

  while (lo < hi) {
    // INVARIANT:
    //[i, lo) <= time_ns
    //[lo, hi) ?
    //[hi, j)  > time_ns

    Cluster** const mid = lo + (hi - lo) / 2;
    assert(mid < hi);

    pCluster = *mid;
    assert(pCluster);
    assert(pCluster->GetIndex() >= 0);
    assert(pCluster->GetIndex() == long(mid - m_pSegment->m_clusters));

    const long long t = pCluster->GetTime();

    if (t <= time_ns)
      lo = mid + 1;
    else
      hi = mid;

    assert(lo <= hi);
  }

  assert(lo == hi);
  assert(lo > i);
  assert(lo <= j);

  pCluster = *--lo;
  assert(pCluster);
  assert(pCluster->GetTime() <= time_ns);

  pResult = pCluster->GetEntry(this, time_ns);

  if ((pResult != 0) && !pResult->EOS())  // found a keyframe
    return 0;

  while (lo != i) {
    pCluster = *--lo;
    assert(pCluster);
    assert(pCluster->GetTime() <= time_ns);

    pResult = pCluster->GetEntry(this, time_ns);

    if ((pResult != 0) && !pResult->EOS())
      return 0;
  }

  // weird: we're on the first cluster, but no keyframe found
  // should never happen but we must return something anyway

  pResult = GetEOS();
  return 0;
}